

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_4x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined1 auVar5 [16];
  __m128i y_select;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar3 = _DAT_005157f0;
  auVar2 = _DAT_005157e0;
  uVar1 = *(undefined4 *)top_row;
  auVar7 = pshuflw(ZEXT116(left_column[7]),ZEXT116(left_column[7]),0);
  auVar5[0] = (byte)uVar1;
  auVar5[1] = 0;
  auVar8._0_12_ = ZEXT712(0);
  auVar8[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar8[0xd] = 0;
  auVar8._14_2_ = auVar7._6_2_;
  auVar6._12_4_ = auVar8._12_4_;
  auVar6._0_10_ = (unkuint10)0;
  auVar6._10_2_ = auVar7._4_2_;
  auVar5[9] = 0;
  auVar5[8] = (byte)((uint)uVar1 >> 0x10);
  auVar5._10_6_ = auVar6._10_6_;
  auVar5._6_2_ = auVar7._2_2_;
  auVar5[5] = 0;
  auVar5[4] = (byte)((uint)uVar1 >> 8);
  auVar5._2_2_ = auVar7._0_2_;
  iVar4 = 8;
  auVar6 = _DAT_00515770;
  do {
    auVar8 = pshufb(auVar2,auVar6);
    auVar7 = pshufb(auVar3,auVar6);
    auVar12._0_12_ = auVar8._0_12_;
    auVar12._12_2_ = auVar8._6_2_;
    auVar12._14_2_ = auVar7._6_2_;
    auVar11._12_4_ = auVar12._12_4_;
    auVar11._0_10_ = auVar8._0_10_;
    auVar11._10_2_ = auVar7._4_2_;
    auVar10._10_6_ = auVar11._10_6_;
    auVar10._0_8_ = auVar8._0_8_;
    auVar10._8_2_ = auVar8._4_2_;
    auVar9._8_8_ = auVar10._8_8_;
    auVar9._6_2_ = auVar7._2_2_;
    auVar9._4_2_ = auVar8._2_2_;
    auVar9._0_2_ = auVar8._0_2_;
    auVar9._2_2_ = auVar7._0_2_;
    auVar8 = pmaddwd(auVar9,auVar5);
    auVar13._0_4_ = auVar8._0_4_ + 0x80;
    auVar13._4_4_ = auVar8._4_4_ + 0x80;
    auVar13._8_4_ = auVar8._8_4_ + 0x80;
    auVar13._12_4_ = auVar8._12_4_ + 0x80;
    auVar8 = pshufb(auVar13,ZEXT416(0xd090501));
    *(int *)dst = auVar8._0_4_;
    dst = dst + stride;
    auVar7._0_2_ = auVar6._0_2_ + 0x202;
    auVar7._2_2_ = auVar6._2_2_ + 0x202;
    auVar7._4_2_ = auVar6._4_2_ + 0x202;
    auVar7._6_2_ = auVar6._6_2_ + 0x202;
    auVar7._8_2_ = auVar6._8_2_ + 0x202;
    auVar7._10_2_ = auVar6._10_2_ + 0x202;
    auVar7._12_2_ = auVar6._12_2_ + 0x202;
    auVar7._14_2_ = auVar6._14_2_ + 0x202;
    iVar4 = iVar4 + -1;
    auVar6 = auVar7;
  } while (iVar4 != 0);
  return;
}

Assistant:

static AOM_FORCE_INLINE __m128i Load4(const void *src) {
  // With new compilers such as clang 8.0.0 we can use the new _mm_loadu_si32
  // intrinsic. Both _mm_loadu_si32(src) and the code here are compiled into a
  // movss instruction.
  //
  // Until compiler support of _mm_loadu_si32 is widespread, use of
  // _mm_loadu_si32 is banned.
  int val;
  memcpy(&val, src, sizeof(val));
  return _mm_cvtsi32_si128(val);
}